

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_writer.h
# Opt level: O3

void __thiscall
cppwinrt::writer_base<cppwinrt::writer>::write_segment<unsigned_int,unsigned_int>
          (writer_base<cppwinrt::writer> *this,string_view *value,uint *first,uint *rest)

{
  byte bVar1;
  size_type sVar2;
  void *__buf;
  ulong uVar3;
  string_view local_38;
  
  sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_of(value,"^%@",0,3);
  if (sVar2 == 0xffffffffffffffff) {
    __assert_fail("offset != std::string_view::npos",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/oldnewthing[P]cppwinrt/cppwinrt/text_writer.h"
                  ,0x125,
                  "void cppwinrt::writer_base<cppwinrt::writer>::write_segment(const std::string_view &, const First &, const Rest &...) [T = cppwinrt::writer, First = unsigned int, Rest = <unsigned int>]"
                 );
  }
  uVar3 = value->_M_len;
  if (sVar2 <= value->_M_len) {
    uVar3 = sVar2;
  }
  std::vector<char,std::allocator<char>>::_M_range_insert<char_const*>
            ((vector<char,std::allocator<char>> *)&this->m_first,
             (this->m_first).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish,value->_M_str,value->_M_str + uVar3);
  bVar1 = value->_M_str[sVar2];
  if (bVar1 == 0x25) {
    write(this,*first,__buf,(ulong)bVar1);
    uVar3 = sVar2 + 1;
    if (value->_M_len <= sVar2) goto LAB_00173fd9;
    local_38._M_len = value->_M_len - uVar3;
    local_38._M_str = value->_M_str + uVar3;
    write_segment<unsigned_int>(this,&local_38,rest);
  }
  else {
    if (bVar1 != 0x5e) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/oldnewthing[P]cppwinrt/cppwinrt/text_writer.h"
                    ,0x13d,
                    "void cppwinrt::writer_base<cppwinrt::writer>::write_segment(const std::string_view &, const First &, const Rest &...) [T = cppwinrt::writer, First = unsigned int, Rest = <unsigned int>]"
                   );
    }
    if (sVar2 == value->_M_len - 1) {
      __assert_fail("offset != value.size() - 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/oldnewthing[P]cppwinrt/cppwinrt/text_writer.h"
                    ,0x12a,
                    "void cppwinrt::writer_base<cppwinrt::writer>::write_segment(const std::string_view &, const First &, const Rest &...) [T = cppwinrt::writer, First = unsigned int, Rest = <unsigned int>]"
                   );
    }
    write_impl(this,value->_M_str[sVar2 + 1]);
    uVar3 = sVar2 + 2;
    local_38._M_len = value->_M_len - uVar3;
    if (value->_M_len < uVar3) {
LAB_00173fd9:
      std::__throw_out_of_range_fmt
                ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                 uVar3);
    }
    local_38._M_str = value->_M_str + uVar3;
    write_segment<unsigned_int,unsigned_int>(this,&local_38,first,rest);
  }
  return;
}

Assistant:

void write_segment(std::string_view const& value, First const& first, Rest const&... rest)
        {
            auto offset = value.find_first_of("^%@");
            assert(offset != std::string_view::npos);
            write(value.substr(0, offset));

            if (value[offset] == '^')
            {
                assert(offset != value.size() - 1);

                write(value[offset + 1]);
                write_segment(value.substr(offset + 2), first, rest...);
            }
            else
            {
                if (value[offset] == '%')
                {
                    static_cast<T*>(this)->write(first);
                }
                else
                {
                    if constexpr (std::is_convertible_v<First, std::string_view>)
                    {
                        static_cast<T*>(this)->write_code(first);
                    }
                    else
                    {
                        assert(false); // '@' placeholders are only for text.
                    }
                }

                write_segment(value.substr(offset + 1), rest...);
            }
        }